

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# syntax_gtest_tests.cpp
# Opt level: O1

void __thiscall
test::syntax_gtest_tests::iu_SyntaxTest_x_iutest_x_AlmostLongDoubleEq_Test::Body
          (iu_SyntaxTest_x_iutest_x_AlmostLongDoubleEq_Test *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  bool bVar2;
  longdouble *in_R9;
  AssertionResult iutest_ar;
  allocator<char> local_201;
  AssertionResult local_200;
  longdouble local_1d8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1c8;
  char *local_1b8;
  undefined8 local_1b0;
  undefined1 local_1a8 [400];
  
  local_1d8 = (longdouble)1;
  local_1a8._0_10_ = local_1d8;
  iutest::internal::CmpHelperEQ<long_double,long_double>
            (&local_200,(internal *)0x336a30,"x",(char *)&local_1d8,(longdouble *)local_1a8,in_R9);
  bVar2 = local_200.m_result;
  if (local_200.m_result == false) {
    memset((iu_global_format_stringstream *)local_1a8,0,0x188);
    iutest::iu_global_format_stringstream::iu_global_format_stringstream
              ((iu_global_format_stringstream *)local_1a8);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1d8,local_200.m_message._M_dataplus._M_p,&local_201);
    local_1b8 = 
    "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/syntax_gtest_tests.cpp"
    ;
    local_1b0._0_4_ = 0x121;
    local_1b0._4_4_ = 2;
    iutest::AssertionHelper::OnFixed((AssertionHelper *)&local_1d8,(Fixed *)local_1a8,false);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1d8._0_8_ != &local_1c8) {
      operator_delete(local_1d8._0_8_,local_1c8._M_allocated_capacity + 1);
    }
    std::__cxx11::stringstream::~stringstream((stringstream *)local_1a8);
    std::ios_base::~ios_base((ios_base *)(local_1a8 + 0x80));
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_200.m_message._M_dataplus._M_p != &local_200.m_message.field_2) {
    operator_delete(local_200.m_message._M_dataplus._M_p,
                    local_200.m_message.field_2._M_allocated_capacity + 1);
  }
  if (bVar2 != false) {
    local_1d8 = (longdouble)1;
    local_1a8._0_10_ = local_1d8;
    iutest::internal::CmpHelperEQ<long_double,long_double>
              (&local_200,(internal *)0x336a30,"x",(char *)&local_1d8,(longdouble *)local_1a8,in_R9)
    ;
    if (local_200.m_result == false) {
      memset((iu_global_format_stringstream *)local_1a8,0,0x188);
      iutest::iu_global_format_stringstream::iu_global_format_stringstream
                ((iu_global_format_stringstream *)local_1a8);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_1d8,local_200.m_message._M_dataplus._M_p,&local_201);
      local_1b8 = 
      "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/syntax_gtest_tests.cpp"
      ;
      local_1b0._0_4_ = 0x123;
      local_1b0._4_4_ = 1;
      iutest::AssertionHelper::OnFixed((AssertionHelper *)&local_1d8,(Fixed *)local_1a8,false);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1d8._0_8_ != &local_1c8) {
        operator_delete(local_1d8._0_8_,local_1c8._M_allocated_capacity + 1);
      }
      std::__cxx11::stringstream::~stringstream((stringstream *)local_1a8);
      std::ios_base::~ios_base((ios_base *)(local_1a8 + 0x80));
    }
    paVar1 = &local_200.m_message.field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_200.m_message._M_dataplus._M_p != paVar1) {
      operator_delete(local_200.m_message._M_dataplus._M_p,
                      local_200.m_message.field_2._M_allocated_capacity + 1);
    }
    local_1d8 = (longdouble)1;
    local_1a8._0_10_ = local_1d8;
    iutest::internal::CmpHelperEQ<long_double,long_double>
              (&local_200,(internal *)0x336a30,"x",(char *)&local_1d8,(longdouble *)local_1a8,in_R9)
    ;
    if (local_200.m_result == false) {
      memset((iu_global_format_stringstream *)local_1a8,0,0x188);
      iutest::iu_global_format_stringstream::iu_global_format_stringstream
                ((iu_global_format_stringstream *)local_1a8);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_1d8,local_200.m_message._M_dataplus._M_p,&local_201);
      local_1b8 = 
      "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/syntax_gtest_tests.cpp"
      ;
      local_1b0._0_4_ = 0x125;
      local_1b0._4_4_ = 0xffffffff;
      iutest::AssertionHelper::OnFixed((AssertionHelper *)&local_1d8,(Fixed *)local_1a8,false);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1d8._0_8_ != &local_1c8) {
        operator_delete(local_1d8._0_8_,local_1c8._M_allocated_capacity + 1);
      }
      std::__cxx11::stringstream::~stringstream((stringstream *)local_1a8);
      std::ios_base::~ios_base((ios_base *)(local_1a8 + 0x80));
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_200.m_message._M_dataplus._M_p != paVar1) {
      operator_delete(local_200.m_message._M_dataplus._M_p,
                      local_200.m_message.field_2._M_allocated_capacity + 1);
    }
    local_1d8 = (longdouble)1;
    local_1a8._0_10_ = local_1d8;
    iutest::internal::CmpHelperEQ<long_double,long_double>
              (&local_200,(internal *)0x336a30,"x",(char *)&local_1d8,(longdouble *)local_1a8,in_R9)
    ;
    if (local_200.m_result == false) {
      memset((iu_global_format_stringstream *)local_1a8,0,0x188);
      iutest::iu_global_format_stringstream::iu_global_format_stringstream
                ((iu_global_format_stringstream *)local_1a8);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_1d8,local_200.m_message._M_dataplus._M_p,&local_201);
      local_1b8 = 
      "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/syntax_gtest_tests.cpp"
      ;
      local_1b0._0_4_ = 0x127;
      local_1b0._4_4_ = 0xfffffffd;
      iutest::AssertionHelper::OnFixed((AssertionHelper *)&local_1d8,(Fixed *)local_1a8,false);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1d8._0_8_ != &local_1c8) {
        operator_delete(local_1d8._0_8_,local_1c8._M_allocated_capacity + 1);
      }
      std::__cxx11::stringstream::~stringstream((stringstream *)local_1a8);
      std::ios_base::~ios_base((ios_base *)(local_1a8 + 0x80));
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_200.m_message._M_dataplus._M_p != paVar1) {
      operator_delete(local_200.m_message._M_dataplus._M_p,
                      local_200.m_message.field_2._M_allocated_capacity + 1);
    }
  }
  return;
}

Assistant:

TEST(SyntaxTest, AlmostLongDoubleEq)
{
    if( long double x = 1.0l )
        ASSERT_ALMOST_EQ(1.0l, x);
    if( long double x = 1.0l )
        EXPECT_ALMOST_EQ(1.0l, x);
    if( long double x = 1.0l )
        INFORM_ALMOST_EQ(1.0l, x);
    if( long double x = 1.0l )
        ASSUME_ALMOST_EQ(1.0l, x);
}